

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O1

void __thiscall
chrono::ChArchiveExplorer::PrepareSearch(ChArchiveExplorer *this,string *msearched_property)

{
  istream *piVar1;
  string segment;
  stringstream test;
  value_type local_1c8;
  stringstream local_1a8 [128];
  ios_base local_128 [264];
  
  ClearSearch(this);
  std::__cxx11::string::_M_assign((string *)&this->searched_property);
  std::__cxx11::stringstream::stringstream(local_1a8,(string *)msearched_property,_S_out|_S_in);
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)&local_1c8,'/');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->search_tokens,&local_1c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void PrepareSearch(const std::string& msearched_property) {
        ClearSearch();
        this->searched_property = msearched_property;
        std::stringstream test(msearched_property);
        std::string segment;
        
        while (std::getline(test, segment, '/')) {
            search_tokens.push_back(segment);
        }
    }